

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O0

int ddShuffle(DdManager *table,int *permutation)

{
  int iVar1;
  int iVar2;
  int result;
  int numvars;
  int position;
  int level;
  int index;
  int *permutation_local;
  DdManager *table_local;
  
  ddTotalNumberSwapping = 0;
  iVar1 = table->size;
  numvars = 0;
  while( true ) {
    if (iVar1 <= numvars) {
      return 1;
    }
    iVar2 = ddSiftUp(table,table->perm[permutation[numvars]],numvars);
    if (iVar2 == 0) break;
    numvars = numvars + 1;
  }
  return 0;
}

Assistant:

static int
ddShuffle(
  DdManager * table,
  DdHalfWord * permutation,
  int  lower,
  int  upper)
{
    DdHalfWord  index;
    int         level;
    int         position;
#if 0
    int         numvars;
#endif
    int         result;
#ifdef DD_STATS
    long        localTime;
    int         initialSize;
#ifdef DD_VERBOSE
    int         finalSize;
#endif
    int         previousSize;
#endif

#ifdef DD_STATS
    localTime = util_cpu_time();
    initialSize = table->keys - table->isolated;
#endif

#if 0
    numvars = table->size;

    (void) fprintf(table->out,"%d:", ddTotalShuffles);
    for (level = 0; level < numvars; level++) {
        (void) fprintf(table->out," %d", table->invperm[level]);
    }
    (void) fprintf(table->out,"\n");
#endif

    for (level = 0; level <= upper - lower; level++) {
        index = permutation[level];
        position = table->perm[index];
#ifdef DD_STATS
        previousSize = table->keys - table->isolated;
#endif
        result = ddSiftUp(table,position,level+lower);
        if (!result) return(0);
    }

#ifdef DD_STATS
    ddTotalShuffles++;
#ifdef DD_VERBOSE
    finalSize = table->keys - table->isolated;
    if (finalSize < initialSize) {
        (void) fprintf(table->out,"-");
    } else if (finalSize > initialSize) {
        (void) fprintf(table->out,"+");
    } else {
        (void) fprintf(table->out,"=");
    }
    if ((ddTotalShuffles & 63) == 0) (void) fprintf(table->out,"\n");
    fflush(table->out);
#endif
#endif

    return(1);

}